

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8,RegSlot R9,RegSlot R10,RegSlot R11,
          RegSlot R12,RegSlot R13,RegSlot R14,RegSlot R15,RegSlot R16,RegSlot R17)

{
  bool bVar1;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined2 local_28;
  undefined2 local_26;
  OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if (((((((DAT_0143bfdd == '\0') && (local_2c = (undefined2)R0, R0 < 0x10000)) &&
         (local_2a = (undefined2)R1, R1 < 0x10000)) &&
        ((local_28 = (undefined2)R2, R2 < 0x10000 && (local_26 = (undefined2)R3, R3 < 0x10000)))) &&
       ((layout.R0 = (RegSlotType)R4, R4 < 0x10000 &&
        ((layout.R1 = (RegSlotType)R5, R5 < 0x10000 && (layout.R2 = (RegSlotType)R6, R6 < 0x10000)))
        ))) && (layout.R3 = (RegSlotType)R7, R7 < 0x10000)) &&
     (((((layout.R4 = (RegSlotType)R8, R8 < 0x10000 && (layout.R5 = (RegSlotType)R9, R9 < 0x10000))
        && (layout.R6 = (RegSlotType)R10, R10 < 0x10000)) &&
       (((layout.R7 = (RegSlotType)R11, R11 < 0x10000 &&
         (layout.R8 = (RegSlotType)R12, R12 < 0x10000)) &&
        ((layout.R9 = (RegSlotType)R13, R13 < 0x10000 &&
         ((layout.R10 = (RegSlotType)R14, R14 < 0x10000 &&
          (layout.R11 = (RegSlotType)R15, R15 < 0x10000)))))))) &&
      ((layout.R12 = (RegSlotType)R16, R16 < 0x10000 &&
       (layout.R13 = (RegSlotType)R17, R17 < 0x10000)))))) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_2c,0x24,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg18(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8,
        RegSlot R9, RegSlot R10, RegSlot R11, RegSlot R12, RegSlot R13, RegSlot R14, RegSlot R15, RegSlot R16, RegSlot R17)
    {
        OpLayoutT_AsmReg18<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.R4, R4) &&
            SizePolicy::Assign(layout.R5, R5) && SizePolicy::Assign(layout.R6, R6) && SizePolicy::Assign(layout.R7, R7) && SizePolicy::Assign(layout.R8, R8) && SizePolicy::Assign(layout.R9, R9) &&
            SizePolicy::Assign(layout.R10, R10) && SizePolicy::Assign(layout.R11, R11) && SizePolicy::Assign(layout.R12, R12) && SizePolicy::Assign(layout.R13, R13) && SizePolicy::Assign(layout.R14, R14) &&
            SizePolicy::Assign(layout.R15, R15) && SizePolicy::Assign(layout.R16, R16) && SizePolicy::Assign(layout.R17, R17))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }